

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O2

size_t nni_aio_iov_advance(nni_aio *aio,size_t n)

{
  ulong uVar1;
  size_t sVar2;
  nni_iov *pnVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  sVar6 = n;
  while( true ) {
    if (n == 0) {
      return sVar6;
    }
    if (aio->a_nio == 0) {
      nni_panic("%s: %d: assert err: %s",
                "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/aio.c",
                0x2e4,"aio->a_nio != 0");
    }
    uVar1 = aio->a_iov[0].iov_len;
    if (n <= uVar1 && uVar1 - n != 0) break;
    sVar6 = sVar6 - uVar1;
    uVar5 = aio->a_nio - 1;
    aio->a_nio = uVar5;
    pnVar3 = aio->a_iov;
    for (uVar4 = 0; pnVar3 = pnVar3 + 1, uVar4 < uVar5; uVar4 = uVar4 + 1) {
      sVar2 = pnVar3->iov_len;
      pnVar3[-1].iov_buf = pnVar3->iov_buf;
      pnVar3[-1].iov_len = sVar2;
      uVar5 = aio->a_nio;
    }
    n = n - uVar1;
    aio->a_iov[uVar5].iov_buf = (void *)0x0;
    aio->a_iov[uVar5].iov_len = 0;
  }
  aio->a_iov[0].iov_len = uVar1 - n;
  aio->a_iov[0].iov_buf = (void *)((long)aio->a_iov[0].iov_buf + n);
  return 0;
}

Assistant:

size_t
nni_aio_iov_advance(nni_aio *aio, size_t n)
{
	size_t residual = n;
	while (n) {
		NNI_ASSERT(aio->a_nio != 0);
		if (aio->a_iov[0].iov_len > n) {
			aio->a_iov[0].iov_len -= n;
			NNI_INCPTR(aio->a_iov[0].iov_buf, n);
			return (0); // we used all of "n"
		}
		residual -= aio->a_iov[0].iov_len;
		n -= aio->a_iov[0].iov_len;
		aio->a_nio--;
		for (unsigned i = 0; i < aio->a_nio; i++) {
			aio->a_iov[i] = aio->a_iov[i + 1];
		}
		aio->a_iov[aio->a_nio].iov_buf = NULL; // serves as indicator
		aio->a_iov[aio->a_nio].iov_len = 0;    // serves as indicator
	}
	return (residual); // we might not have used all of n for this iov
}